

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O0

Debugger * Debugger::GetDebugger(JsRuntimeHandle runtime)

{
  Debugger *this;
  JsRuntimeHandle runtime_local;
  
  if (debugger == (Debugger *)0x0) {
    this = (Debugger *)operator_new(0x18);
    Debugger(this,runtime);
    debugger = this;
    Initialize(this);
  }
  return debugger;
}

Assistant:

Debugger * Debugger::GetDebugger(JsRuntimeHandle runtime)
{
    if (Debugger::debugger == nullptr)
    {
        Debugger::debugger = new Debugger(runtime);
        Debugger::debugger->Initialize();
    }

    return Debugger::debugger;
}